

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_context.cpp
# Opt level: O0

uint16_t __thiscall r_exec::HLPContext::get_object_code_size(HLPContext *this)

{
  Data DVar1;
  HLPOverlay *this_00;
  uint16_t id;
  int iVar2;
  Code *pCVar3;
  size_t sVar4;
  HLPContext *this_local;
  
  DVar1 = (this->super__Context).data;
  if (DVar1 == STEM) {
    pCVar3 = HLPOverlay::get_unpacked_object((HLPOverlay *)(this->super__Context).overlay);
    iVar2 = (*(pCVar3->super__Object)._vptr__Object[6])();
    this_local._6_2_ = (uint16_t)iVar2;
  }
  else if (DVar1 == VALUE_ARRAY) {
    sVar4 = r_code::vector<r_code::Atom>::size(&((this->super__Context).overlay)->values);
    this_local._6_2_ = (uint16_t)sVar4;
  }
  else if (DVar1 == BINDING_MAP) {
    this_00 = (HLPOverlay *)(this->super__Context).overlay;
    operator[](this,0);
    id = r_code::Atom::asIndex();
    this_local._6_2_ = HLPOverlay::get_value_code_size(this_00,id);
  }
  else {
    this_local._6_2_ = 0;
  }
  return this_local._6_2_;
}

Assistant:

uint16_t HLPContext::get_object_code_size() const
{
    switch (data) {
    case STEM:
        return ((HLPOverlay *)overlay)->get_unpacked_object()->code_size();

    case BINDING_MAP:
        return ((HLPOverlay *)overlay)->get_value_code_size((*this)[0].asIndex());

    case VALUE_ARRAY:
        return overlay->values.size();

    default:
        return 0;
    }
}